

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

tuple<absl::CommandLineFlag_*,_bool>
absl::flags_internal::anon_unknown_0::LocateFlag(string_view flag_name)

{
  CommandLineFlag *pCVar1;
  undefined1 uVar2;
  short *in_RDX;
  CommandLineFlag *extraout_RDX;
  _Head_base<0UL,_absl::CommandLineFlag_*,_false> _Var3;
  CommandLineFlag *extraout_RDX_00;
  absl *this;
  tuple<absl::CommandLineFlag_*,_bool> tVar4;
  string_view name;
  string_view name_00;
  
  this = (absl *)flag_name._M_str;
  name._M_str = (char *)in_RDX;
  name._M_len = (size_t)in_RDX;
  pCVar1 = FindCommandLineFlag(this,name);
  if (pCVar1 == (CommandLineFlag *)0x0) {
    if (((absl *)0x1 < this) && (*in_RDX == 0x6f6e)) {
      name_00._M_str = (char *)extraout_RDX;
      name_00._M_len = (size_t)(in_RDX + 1);
      pCVar1 = FindCommandLineFlag(this + -2,name_00);
      uVar2 = 1;
      _Var3._M_head_impl = extraout_RDX_00;
      goto LAB_0011156b;
    }
    pCVar1 = (CommandLineFlag *)0x0;
  }
  uVar2 = 0;
  _Var3._M_head_impl = extraout_RDX;
LAB_0011156b:
  *(undefined1 *)flag_name._M_len = uVar2;
  *(CommandLineFlag **)((undefined1 *)flag_name._M_len + 8) = pCVar1;
  tVar4.super__Tuple_impl<0UL,_absl::CommandLineFlag_*,_bool>.
  super__Head_base<0UL,_absl::CommandLineFlag_*,_false>._M_head_impl = _Var3._M_head_impl;
  tVar4.super__Tuple_impl<0UL,_absl::CommandLineFlag_*,_bool>._0_8_ = pCVar1;
  return (tuple<absl::CommandLineFlag_*,_bool>)
         tVar4.super__Tuple_impl<0UL,_absl::CommandLineFlag_*,_bool>;
}

Assistant:

std::tuple<CommandLineFlag*, bool> LocateFlag(absl::string_view flag_name) {
  CommandLineFlag* flag = absl::FindCommandLineFlag(flag_name);
  bool is_negative = false;

  if (!flag && absl::ConsumePrefix(&flag_name, "no")) {
    flag = absl::FindCommandLineFlag(flag_name);
    is_negative = true;
  }

  return std::make_tuple(flag, is_negative);
}